

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

bool TestInternalObjects(btTransform *trans0,btTransform *trans1,btVector3 *delta_c,btVector3 *axis,
                        btConvexPolyhedron *convex0,btConvexPolyhedron *convex1,btScalar dmin)

{
  float fVar1;
  btScalar bVar2;
  btScalar bVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar bVar7;
  btScalar bVar8;
  btScalar bVar9;
  btScalar bVar10;
  btScalar bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  
  fVar33 = axis->m_floats[0];
  fVar26 = axis->m_floats[1];
  fVar1 = axis->m_floats[2];
  fVar24 = delta_c->m_floats[2] * fVar1 +
           delta_c->m_floats[0] * fVar33 + delta_c->m_floats[1] * fVar26;
  fVar25 = (trans0->m_basis).m_el[2].m_floats[0] * fVar1 +
           (trans0->m_basis).m_el[0].m_floats[0] * fVar33 +
           (trans0->m_basis).m_el[1].m_floats[0] * fVar26;
  fVar27 = (trans1->m_basis).m_el[2].m_floats[0] * fVar1 +
           (trans1->m_basis).m_el[0].m_floats[0] * fVar33 +
           (trans1->m_basis).m_el[1].m_floats[0] * fVar26;
  fVar28 = (trans0->m_basis).m_el[2].m_floats[2] * fVar1 +
           (trans0->m_basis).m_el[0].m_floats[2] * fVar33 +
           (trans0->m_basis).m_el[1].m_floats[2] * fVar26;
  fVar29 = (trans0->m_basis).m_el[2].m_floats[3] * fVar1 +
           (trans0->m_basis).m_el[0].m_floats[3] * fVar33 +
           (trans0->m_basis).m_el[1].m_floats[3] * fVar26;
  fVar36 = (trans0->m_basis).m_el[2].m_floats[1] * fVar1 +
           (trans0->m_basis).m_el[0].m_floats[1] * fVar33 +
           (trans0->m_basis).m_el[1].m_floats[1] * fVar26;
  fVar37 = (trans1->m_basis).m_el[2].m_floats[1] * fVar1 +
           (trans1->m_basis).m_el[0].m_floats[1] * fVar33 +
           (trans1->m_basis).m_el[1].m_floats[1] * fVar26;
  fVar38 = (trans0->m_basis).m_el[2].m_floats[3] * fVar1 +
           (trans0->m_basis).m_el[0].m_floats[3] * fVar33 +
           (trans0->m_basis).m_el[1].m_floats[3] * fVar26;
  fVar39 = (trans0->m_origin).m_floats[0] * fVar1 +
           (trans0->m_basis).m_el[1].m_floats[0] * fVar33 +
           (trans0->m_basis).m_el[2].m_floats[0] * fVar26;
  bVar5 = (convex0->m_extents).m_floats[0];
  bVar6 = (convex0->m_extents).m_floats[2];
  bVar7 = (convex0->m_extents).m_floats[3];
  bVar8 = (convex0->m_extents).m_floats[1];
  bVar9 = (convex0->m_extents).m_floats[3];
  fVar30 = (trans0->m_basis).m_el[2].m_floats[2] * fVar1 +
           (trans0->m_basis).m_el[0].m_floats[2] * fVar33 +
           (trans0->m_basis).m_el[1].m_floats[2] * fVar26;
  fVar31 = (trans1->m_basis).m_el[2].m_floats[2] * fVar1 +
           (trans1->m_basis).m_el[0].m_floats[2] * fVar33 +
           (trans1->m_basis).m_el[1].m_floats[2] * fVar26;
  fVar32 = (trans0->m_origin).m_floats[0] * fVar1 +
           (trans0->m_basis).m_el[1].m_floats[0] * fVar33 +
           (trans0->m_basis).m_el[2].m_floats[0] * fVar26;
  fVar33 = (trans0->m_origin).m_floats[1] * fVar1 +
           (trans0->m_basis).m_el[1].m_floats[1] * fVar33 +
           (trans0->m_basis).m_el[2].m_floats[1] * fVar26;
  uVar12 = -(uint)(fVar25 < 0.0);
  uVar15 = -(uint)(fVar27 < 0.0);
  uVar18 = -(uint)(fVar28 < 0.0);
  uVar21 = -(uint)(fVar29 < 0.0);
  bVar2 = (convex1->m_extents).m_floats[0];
  bVar3 = (convex1->m_extents).m_floats[1];
  uVar13 = -(uint)(fVar36 < 0.0);
  uVar16 = -(uint)(fVar37 < 0.0);
  uVar19 = -(uint)(fVar38 < 0.0);
  uVar22 = -(uint)(fVar39 < 0.0);
  bVar10 = (convex0->m_extents).m_floats[2];
  bVar11 = (convex0->mC).m_floats[0];
  uVar14 = -(uint)(fVar30 < 0.0);
  uVar17 = -(uint)(fVar31 < 0.0);
  uVar20 = -(uint)(fVar32 < 0.0);
  uVar23 = -(uint)(fVar33 < 0.0);
  bVar4 = (convex1->m_extents).m_floats[2];
  auVar34._0_4_ =
       (float)(~uVar14 & (uint)bVar10 | (uint)-bVar10 & uVar14) * fVar30 +
       (float)((uint)-bVar5 & uVar12 | ~uVar12 & (uint)bVar5) * fVar25 +
       (float)((uint)-bVar8 & uVar13 | ~uVar13 & (uint)bVar8) * fVar36;
  auVar34._4_4_ =
       (float)(~uVar17 & (uint)bVar4 | (uint)-bVar4 & uVar17) * fVar31 +
       (float)((uint)-bVar2 & uVar15 | ~uVar15 & (uint)bVar2) * fVar27 +
       (float)((uint)-bVar3 & uVar16 | ~uVar16 & (uint)bVar3) * fVar37;
  auVar34._8_4_ =
       (float)(~uVar20 & (uint)convex0->m_radius | (uint)-convex0->m_radius & uVar20) * fVar32 +
       (float)((uint)-bVar6 & uVar18 | ~uVar18 & (uint)bVar6) * fVar28 +
       (float)((uint)-bVar9 & uVar19 | ~uVar19 & (uint)bVar9) * fVar38;
  auVar34._12_4_ =
       (float)(~uVar23 & (uint)bVar11 | (uint)-bVar11 & uVar23) * fVar33 +
       (float)((uint)-bVar7 & uVar21 | ~uVar21 & (uint)bVar7) * fVar29 +
       (float)((uint)-convex0->m_radius & uVar22 | ~uVar22 & (uint)convex0->m_radius) * fVar39;
  auVar35._4_4_ = convex1->m_radius;
  auVar35._0_4_ = convex0->m_radius;
  auVar35._8_4_ = (convex0->mC).m_floats[1];
  auVar35._12_4_ = (convex0->mC).m_floats[2];
  auVar35 = maxps(auVar34,auVar35);
  fVar26 = auVar35._4_4_ + auVar35._0_4_;
  fVar33 = fVar24 + fVar26;
  fVar26 = fVar26 - fVar24;
  if (fVar26 <= fVar33) {
    fVar33 = fVar26;
  }
  return fVar33 <= dmin;
}

Assistant:

SIMD_FORCE_INLINE btScalar dot(const btVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return	m_floats[0] * v.m_floats[0] +
				m_floats[1] * v.m_floats[1] +
				m_floats[2] * v.m_floats[2];
#endif
	}